

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

CollSeq * sqlite3ExprCollSeq(Parse *pParse,Expr *pExpr)

{
  char *pcVar1;
  ushort uVar2;
  sqlite3 *psVar3;
  Expr *pEVar4;
  ExprList *pEVar5;
  Column *pCVar6;
  byte bVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  HashElem *pHVar11;
  CollSeq *pCVar12;
  Expr *pEVar13;
  ExprList_item *pEVar14;
  CollSeq *pColl;
  
  if (pExpr != (Expr *)0x0) {
    psVar3 = pParse->db;
    do {
      bVar7 = pExpr->op;
      if (bVar7 == 0xb0) {
        bVar7 = pExpr->op2;
      }
      if (bVar7 < 0xa9) {
        if (0x4c < bVar7) {
          if (bVar7 != 0x4d) {
            if (bVar7 == 0x71) {
              pColl = sqlite3GetCollSeq(pParse,psVar3->enc,(CollSeq *)0x0,(pExpr->u).zToken);
              goto LAB_0016e6ec;
            }
            if (bVar7 != 0xa7) goto LAB_0016e5f6;
          }
LAB_0016e650:
          lVar8 = (long)pExpr->iColumn;
          if (lVar8 < 0) {
            return (CollSeq *)0x0;
          }
          pCVar6 = ((pExpr->y).pTab)->aCol;
          uVar2 = pCVar6[lVar8].colFlags;
          if ((uVar2 >> 9 & 1) == 0) {
            pColl = psVar3->pDfltColl;
          }
          else {
            pcVar9 = pCVar6[lVar8].zCnName + -1;
            do {
              pcVar10 = pcVar9 + 1;
              pcVar9 = pcVar9 + 1;
            } while (*pcVar10 != '\0');
            pcVar10 = pcVar9;
            if ((uVar2 & 4) != 0) {
              do {
                pcVar9 = pcVar10 + 1;
                pcVar1 = pcVar10 + 1;
                pcVar10 = pcVar9;
              } while (*pcVar1 != '\0');
            }
            bVar7 = psVar3->enc;
            pHVar11 = findElementWithHash(&psVar3->aCollSeq,pcVar9 + 1,(uint *)0x0);
            if (pHVar11->data == (void *)0x0) {
              return (CollSeq *)0x0;
            }
            pColl = (CollSeq *)((long)pHVar11->data + (ulong)bVar7 * 0x28 + -0x28);
          }
LAB_0016e6ec:
          if (pColl == (CollSeq *)0x0) {
            return (CollSeq *)0x0;
          }
          if (pColl->xCmp == (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0) {
            pCVar12 = sqlite3GetCollSeq(pParse,pParse->db->enc,pColl,pColl->zName);
            if (pCVar12 != (CollSeq *)0x0) {
              return pColl;
            }
            return (CollSeq *)0x0;
          }
          return pColl;
        }
        if (bVar7 == 0x24) goto LAB_0016e5c4;
LAB_0016e5f6:
        if ((pExpr->flags & 0x200) == 0) {
          return (CollSeq *)0x0;
        }
        pEVar13 = pExpr->pLeft;
        if ((pEVar13 == (Expr *)0x0) || ((pEVar13->flags & 0x200) == 0)) {
          pEVar4 = pExpr->pRight;
          pEVar5 = (pExpr->x).pList;
          pEVar13 = pEVar4;
          if ((pEVar5 != (ExprList *)0x0) &&
             ((psVar3->mallocFailed == '\0' && (0 < (long)pEVar5->nExpr)))) {
            lVar8 = 0;
            do {
              pEVar13 = *(Expr **)((long)&pEVar5->a[0].pExpr + lVar8);
              if ((pEVar13->flags & 0x200) != 0) break;
              lVar8 = lVar8 + 0x18;
              pEVar13 = pEVar4;
            } while ((long)pEVar5->nExpr * 0x18 != lVar8);
          }
        }
      }
      else {
        if (bVar7 == 0xae) {
LAB_0016e5c4:
          pEVar14 = (ExprList_item *)&pExpr->pLeft;
        }
        else {
          if (bVar7 != 0xb1) {
            if (bVar7 != 0xa9) goto LAB_0016e5f6;
            goto LAB_0016e650;
          }
          pEVar14 = ((pExpr->x).pList)->a;
        }
        pEVar13 = pEVar14->pExpr;
      }
      pExpr = pEVar13;
    } while (pEVar13 != (Expr *)0x0);
  }
  return (CollSeq *)0x0;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3ExprCollSeq(Parse *pParse, const Expr *pExpr){
  sqlite3 *db = pParse->db;
  CollSeq *pColl = 0;
  const Expr *p = pExpr;
  while( p ){
    int op = p->op;
    if( op==TK_REGISTER ) op = p->op2;
    if( op==TK_AGG_COLUMN || op==TK_COLUMN || op==TK_TRIGGER ){
      int j;
      assert( ExprUseYTab(p) );
      assert( p->y.pTab!=0 );
      if( (j = p->iColumn)>=0 ){
        const char *zColl = sqlite3ColumnColl(&p->y.pTab->aCol[j]);
        pColl = sqlite3FindCollSeq(db, ENC(db), zColl, 0);
      }
      break;
    }
    if( op==TK_CAST || op==TK_UPLUS ){
      p = p->pLeft;
      continue;
    }
    if( op==TK_VECTOR ){
      assert( ExprUseXList(p) );
      p = p->x.pList->a[0].pExpr;
      continue;
    }
    if( op==TK_COLLATE ){
      assert( !ExprHasProperty(p, EP_IntValue) );
      pColl = sqlite3GetCollSeq(pParse, ENC(db), 0, p->u.zToken);
      break;
    }
    if( p->flags & EP_Collate ){
      if( p->pLeft && (p->pLeft->flags & EP_Collate)!=0 ){
        p = p->pLeft;
      }else{
        Expr *pNext  = p->pRight;
        /* The Expr.x union is never used at the same time as Expr.pRight */
        assert( ExprUseXList(p) );
        assert( p->x.pList==0 || p->pRight==0 );
        if( p->x.pList!=0 && !db->mallocFailed ){
          int i;
          for(i=0; ALWAYS(i<p->x.pList->nExpr); i++){
            if( ExprHasProperty(p->x.pList->a[i].pExpr, EP_Collate) ){
              pNext = p->x.pList->a[i].pExpr;
              break;
            }
          }
        }
        p = pNext;
      }
    }else{
      break;
    }
  }
  if( sqlite3CheckCollSeq(pParse, pColl) ){
    pColl = 0;
  }
  return pColl;
}